

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

hugeint_t duckdb::FactorialOperator::Operation<int,duckdb::hugeint_t>(int left)

{
  uint64_t uVar1;
  int64_t iVar2;
  bool bVar3;
  OutOfRangeException *this;
  long value;
  hugeint_t left_00;
  hugeint_t hVar4;
  allocator local_71;
  hugeint_t ret;
  hugeint_t local_60;
  string local_50;
  
  hugeint_t::hugeint_t(&ret,1);
  value = 2;
  do {
    iVar2 = ret.upper;
    uVar1 = ret.lower;
    if (left < value) {
      hVar4.upper = ret.upper;
      hVar4.lower = ret.lower;
      return hVar4;
    }
    hugeint_t::hugeint_t(&local_60,value);
    left_00.upper = iVar2;
    left_00.lower = uVar1;
    bVar3 = TryMultiplyOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (left_00,local_60,&ret);
    value = value + 1;
  } while (bVar3);
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_50,"Value out of range",&local_71);
  OutOfRangeException::OutOfRangeException(this,&local_50);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left) {
		TR ret = 1;
		for (TA i = 2; i <= left; i++) {
			if (!TryMultiplyOperator::Operation(ret, TR(i), ret)) {
				throw OutOfRangeException("Value out of range");
			}
		}
		return ret;
	}